

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotring.cpp
# Opt level: O0

void __thiscall HotRingInstance::HotRing::HotRing(HotRing *this,size_t sz)

{
  size_type local_38;
  size_t htsz;
  allocator<HotRingInstance::hrHead> local_19;
  size_t local_18;
  size_t sz_local;
  HotRing *this_local;
  
  this->r = 0;
  this->findcnt = 0;
  this->maxFindcnt = 0;
  this->minFindcnt = 0x7fffffffffffffff;
  local_18 = sz;
  sz_local = (size_t)this;
  std::allocator<HotRingInstance::hrHead>::allocator(&local_19);
  std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::vector
            (&this->table,0,&local_19);
  std::allocator<HotRingInstance::hrHead>::~allocator(&local_19);
  for (local_38 = 1; local_38 < local_18; local_38 = local_38 << 1) {
  }
  std::vector<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>::resize
            (&this->table,local_38);
  this->hash_mask = local_38 - 1;
  return;
}

Assistant:

HotRing::HotRing(size_t sz):table(0), findcnt(0), minFindcnt(LONG_MAX), maxFindcnt(0) {
        size_t htsz = 1;
        while (htsz < sz) htsz <<= 1;   // 把容量扩充为参数的整数次幂
        table.resize(htsz);
        hash_mask = htsz - 1;
    }